

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void e2e_async_manual_compact_test(void)

{
  time_t tVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  bool in_stack_000001e2;
  bool in_stack_000001e3;
  int in_stack_000001e4;
  fdb_config fconfig;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined8 auStack_338 [31];
  undefined8 local_240 [31];
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined1 local_127;
  undefined4 local_124;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  bVar5 = 0;
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  fdb_get_default_config();
  local_138 = 0x400;
  local_124 = 1;
  local_127 = 2;
  memcpy(local_240,local_148,0xf8);
  puVar3 = local_240;
  puVar4 = auStack_338;
  for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  e2e_async_compact_pattern(in_stack_000001e4,fconfig,in_stack_000001e3,in_stack_000001e2);
  memleak_end();
  if (e2e_async_manual_compact_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","TEST: e2e async manual compact test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","TEST: e2e async manual compact test");
  }
  return;
}

Assistant:

void e2e_async_manual_compact_test() {
    TEST_INIT();
    memleak_start();

    randomize();
    // opts
    fdb_config fconfig = fdb_get_default_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.durability_opt = FDB_DRB_ASYNC;

    // test
    e2e_async_compact_pattern(10, fconfig, false, true);
    memleak_end();
    TEST_RESULT("TEST: e2e async manual compact test");
}